

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalIEJoin::PhysicalIEJoin
          (PhysicalIEJoin *this,LogicalComparisonJoin *op,PhysicalOperator *left,
          PhysicalOperator *right,vector<duckdb::JoinCondition,_true> *cond,JoinType join_type,
          idx_t estimated_cardinality)

{
  vector<duckdb::JoinCondition,_true> *this_00;
  bool bVar1;
  PhysicalIEJoin *pPVar2;
  reference pvVar3;
  pointer pEVar4;
  NotImplementedException *this_01;
  bool bVar5;
  size_type sVar6;
  OrderType OVar7;
  OrderType OVar8;
  OrderType local_99;
  PhysicalIEJoin *local_98;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *local_78;
  vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *local_70;
  string local_68;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_48;
  
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_start =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalRangeJoin::PhysicalRangeJoin
            (&this->super_PhysicalRangeJoin,op,IE_JOIN,left,right,
             (vector<duckdb::JoinCondition,_true> *)&local_48,join_type,estimated_cardinality);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_48);
  (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
  super_CachingPhysicalOperator.super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalIEJoin_02462e58;
  local_90 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &this->join_key_types;
  local_70 = (vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
             &this->lhs_orders;
  local_78 = (vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
             &this->rhs_orders;
  this_00 = &(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions;
  (this->join_key_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->join_key_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->join_key_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  OVar8 = DESCENDING;
  OVar7 = ASCENDING;
  sVar6 = 0;
  bVar5 = true;
  local_98 = this;
LAB_0169ece6:
  pvVar3 = vector<duckdb::JoinCondition,_true>::operator[](this_00,sVar6);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&pvVar3->left);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (local_90,&pEVar4->return_type);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&pvVar3->left);
  (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_80,pEVar4);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&pvVar3->right);
  (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_88,pEVar4);
  local_99 = INVALID;
  switch(pvVar3->comparison) {
  case COMPARE_LESSTHAN:
  case COMPARE_LESSTHANOREQUALTO:
    break;
  case COMPARE_GREATERTHAN:
  case COMPARE_GREATERTHANOREQUALTO:
    goto switchD_0169ed64_caseD_1c;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented join type for IEJoin","");
    NotImplementedException::NotImplementedException(this_01,&local_68);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  OVar8 = OVar7;
switchD_0169ed64_caseD_1c:
  local_68._M_dataplus._M_p._0_1_ = 3;
  local_99 = OVar8;
  ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
  emplace_back<duckdb::OrderType&,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (local_70,&local_99,(OrderByNullType *)&local_68,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_80);
  local_68._M_dataplus._M_p._0_1_ = 3;
  ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
  emplace_back<duckdb::OrderType&,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (local_78,&local_99,(OrderByNullType *)&local_68,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_88);
  if (local_88._M_head_impl != (Expression *)0x0) {
    (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_80._M_head_impl != (Expression *)0x0) {
    (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  pPVar2 = local_98;
  sVar6 = 1;
  OVar8 = ASCENDING;
  OVar7 = DESCENDING;
  bVar1 = !bVar5;
  bVar5 = false;
  if (bVar1) {
    if (2 < (ulong)(((long)(local_98->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                           conditions.
                           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                           .
                           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_98->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                           conditions.
                           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                           .
                           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      sVar6 = 2;
      do {
        pvVar3 = vector<duckdb::JoinCondition,_true>::operator[](this_00,sVar6);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pvVar3->left);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (local_90,&pEVar4->return_type);
        sVar6 = sVar6 + 1;
      } while (sVar6 < (ulong)(((long)(pPVar2->super_PhysicalRangeJoin).super_PhysicalComparisonJoin
                                      .conditions.
                                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                      .
                                      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pPVar2->super_PhysicalRangeJoin).super_PhysicalComparisonJoin
                                      .conditions.
                                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                      .
                                      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
    return;
  }
  goto LAB_0169ece6;
}

Assistant:

PhysicalIEJoin::PhysicalIEJoin(LogicalComparisonJoin &op, PhysicalOperator &left, PhysicalOperator &right,
                               vector<JoinCondition> cond, JoinType join_type, idx_t estimated_cardinality)
    : PhysicalRangeJoin(op, PhysicalOperatorType::IE_JOIN, left, right, std::move(cond), join_type,
                        estimated_cardinality) {

	// 1. let L1 (resp. L2) be the array of column X (resp. Y)
	D_ASSERT(conditions.size() >= 2);
	for (idx_t i = 0; i < 2; ++i) {
		auto &cond = conditions[i];
		D_ASSERT(cond.left->return_type == cond.right->return_type);
		join_key_types.push_back(cond.left->return_type);

		// Convert the conditions to sort orders
		auto left = cond.left->Copy();
		auto right = cond.right->Copy();
		auto sense = OrderType::INVALID;

		// 2. if (op1 ∈ {>, ≥}) sort L1 in descending order
		// 3. else if (op1 ∈ {<, ≤}) sort L1 in ascending order
		// 4. if (op2 ∈ {>, ≥}) sort L2 in ascending order
		// 5. else if (op2 ∈ {<, ≤}) sort L2 in descending order
		switch (cond.comparison) {
		case ExpressionType::COMPARE_GREATERTHAN:
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
			sense = i ? OrderType::ASCENDING : OrderType::DESCENDING;
			break;
		case ExpressionType::COMPARE_LESSTHAN:
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			sense = i ? OrderType::DESCENDING : OrderType::ASCENDING;
			break;
		default:
			throw NotImplementedException("Unimplemented join type for IEJoin");
		}
		lhs_orders.emplace_back(sense, OrderByNullType::NULLS_LAST, std::move(left));
		rhs_orders.emplace_back(sense, OrderByNullType::NULLS_LAST, std::move(right));
	}

	for (idx_t i = 2; i < conditions.size(); ++i) {
		auto &cond = conditions[i];
		D_ASSERT(cond.left->return_type == cond.right->return_type);
		join_key_types.push_back(cond.left->return_type);
	}
}